

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

fasttext_autotune_t * cft_autotune_new(fasttext_t *handle)

{
  fasttext_autotune_t *pfVar1;
  shared_ptr<fasttext::FastText> ft_ptr;
  FastText *ft;
  FastText *in_stack_ffffffffffffffc8;
  shared_ptr<fasttext::FastText> *in_stack_ffffffffffffffd0;
  shared_ptr<fasttext::FastText> *in_stack_ffffffffffffffd8;
  Autotune *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<fasttext::FastText>::shared_ptr<fasttext::FastText,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pfVar1 = (fasttext_autotune_t *)operator_new(0x40);
  fasttext::Autotune::Autotune(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<fasttext::FastText>::~shared_ptr((shared_ptr<fasttext::FastText> *)0x19024c);
  return pfVar1;
}

Assistant:

fasttext_autotune_t* cft_autotune_new(fasttext_t *handle) {
    FastText* ft = (FastText*)handle;
    std::shared_ptr<FastText> ft_ptr(ft);
    return (fasttext_autotune_t*)(new Autotune(ft_ptr));
}